

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O3

void do_log_uptime(FileBuff log)

{
  int fd;
  int iVar1;
  size_t sVar2;
  double dVar3;
  char buff [65];
  char acStack_68 [64];
  undefined1 local_28;
  
  fd = open("/proc/uptime",0);
  if (-1 < fd) {
    iVar1 = unix_read(fd,acStack_68,0x40);
    close(fd);
    local_28 = 0;
    if (-1 < iVar1) {
      dVar3 = strtod(acStack_68,(char **)0x0);
      snprintf(acStack_68,0x41,"%lld\n",(long)(dVar3 * 100.0));
      sVar2 = strlen(acStack_68);
      file_buff_write(log,acStack_68,(int)sVar2);
    }
  }
  return;
}

Assistant:

static void
do_log_uptime(FileBuff  log)
{
    char  buff[65];
    int   fd, ret, len;

    fd = open("/proc/uptime",O_RDONLY);
    if (fd >= 0) {
        int  ret;
        ret = unix_read(fd, buff, 64);
        close(fd);
        buff[64] = 0;
        if (ret >= 0) {
            long long  jiffies = 100LL*strtod(buff,NULL);
            int        len;
            snprintf(buff,sizeof(buff),"%lld\n",jiffies);
            len = strlen(buff);
            file_buff_write(log, buff, len);
        }
    }
}